

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::logError
          (FunctionalTest7_8 *this,GLuint *combination,vec4<float> *left,vec4<float> *right,
          vec4<unsigned_int> *indices,vec4<float> *vec4_expected,vec4<float> *vec4_result,
          GLuint array_length,bool *result)

{
  ostringstream *this_00;
  long lVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  GLchar functions [4];
  GLchar functions_inverted [4];
  GLchar functions_dynamic_inverted [4];
  GLchar functions_dynamic [4];
  GLuint dynamic_combination [4];
  MessageBuilder message;
  vec4<float> dynamic_values [5];
  vec4<float> constant_values [5];
  byte abStack_414 [4];
  FunctionalTest7_8 *local_410;
  byte abStack_404 [4];
  byte abStack_400 [4];
  byte abStack_3fc [4];
  GLuint local_3f8 [6];
  vec4<float> *local_3e0;
  undefined1 local_3d8 [120];
  ios_base local_360 [264];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_3f8[0] = combination[indices->m_x];
  local_3f8[1] = combination[indices->m_y];
  local_3f8[2] = combination[indices->m_z];
  local_3f8[3] = combination[indices->m_w];
  lVar1 = 3;
  lVar3 = 0;
  do {
    bVar4 = combination[lVar3] == 0 | 0x2a;
    bVar5 = local_3f8[lVar3] == 0 | 0x2a;
    abStack_414[lVar3] = bVar4;
    abStack_404[lVar1] = bVar4;
    abStack_3fc[lVar3] = bVar5;
    abStack_400[lVar1] = bVar5;
    lVar3 = lVar3 + 1;
    lVar1 = lVar1 + -1;
  } while (lVar3 != 4);
  local_88 = 0x400000003f800000;
  uStack_80 = 0x4080000040400000;
  local_78 = 0xc0c00000c0a00000;
  uStack_70 = 0xc1000000c0e00000;
  local_68 = 0xc0000000bf800000;
  uStack_60 = 0xc0800000c0400000;
  local_58 = 0x40c0000040a00000;
  uStack_50 = 0x4100000040e00000;
  local_48 = 0x400000003f800000;
  uStack_40 = 0x4080000040400000;
  local_258._0_4_ = left->m_x;
  local_258._4_4_ = left->m_y;
  uStack_250._0_4_ = left->m_z;
  uStack_250._4_4_ = left->m_w;
  local_248._0_4_ = right->m_x;
  local_248._4_4_ = right->m_y;
  uStack_240._0_4_ = right->m_z;
  uStack_240._4_4_ = right->m_w;
  local_238._0_4_ = right->m_x;
  local_238._4_4_ = right->m_y;
  uStack_230._0_4_ = right->m_z;
  uStack_230._4_4_ = right->m_w;
  local_228._0_4_ = right->m_x;
  local_228._4_4_ = right->m_y;
  uStack_220._0_4_ = right->m_z;
  uStack_220._4_4_ = right->m_w;
  local_218 = right->m_x;
  fStack_214 = right->m_y;
  fStack_210 = right->m_z;
  fStack_20c = right->m_w;
  this_00 = (ostringstream *)(local_3d8 + 8);
  uVar2 = 0;
  local_410 = this;
  local_3e0 = vec4_expected;
  do {
    if (result[uVar2] == false) {
      (*(code *)((long)&DAT_01a99c20 + (long)(int)(&DAT_01a99c20)[uVar2 & 0xffffffff]))();
      return;
    }
    if (array_length != 4) {
      local_3d8._0_8_ = ((local_410->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Error. Invalid array length: ",0x1d);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Expected 4.",0xd);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_360);
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 7);
  return;
}

Assistant:

void FunctionalTest7_8::logError(const glw::GLuint combination[4], const Utils::vec4<glw::GLfloat>& left,
								 const Utils::vec4<glw::GLfloat>& right, const Utils::vec4<glw::GLuint>& indices,
								 const Utils::vec4<glw::GLfloat> vec4_expected[7],
								 const Utils::vec4<glw::GLfloat> vec4_result[7], glw::GLuint array_length,
								 bool result[7]) const
{
	static const GLuint n_functions  = 4;
	static const GLuint n_operations = 7;

	/* Indices used by "dynamic" operations, range <0..4> */
	const GLuint dynamic_combination[4] = { combination[indices.m_x], combination[indices.m_y],
											combination[indices.m_z], combination[indices.m_w] };

	/* Function symbols */
	GLchar functions[4];
	GLchar functions_inverted[4];
	GLchar functions_dynamic[4];
	GLchar functions_dynamic_inverted[4];

	for (GLuint i = 0; i < n_functions; ++i)
	{
		GLchar function			= (0 == combination[i]) ? '+' : '*';
		GLchar dynamic_function = (0 == dynamic_combination[i]) ? '+' : '*';

		functions[i]									= function;
		functions_inverted[n_functions - i - 1]			= function;
		functions_dynamic[i]							= dynamic_function;
		functions_dynamic_inverted[n_functions - i - 1] = dynamic_function;
	}

	/* Values used by "constant" operations, come from shader code */
	const Utils::vec4<glw::GLfloat> constant_values[] = { Utils::vec4<glw::GLfloat>(1, 2, 3, 4),
														  Utils::vec4<glw::GLfloat>(-5, -6, -7, -8),
														  Utils::vec4<glw::GLfloat>(-1, -2, -3, -4),
														  Utils::vec4<glw::GLfloat>(5, 6, 7, 8),
														  Utils::vec4<glw::GLfloat>(1, 2, 3, 4) };

	/* Values used by non-"constant" operations */
	Utils::vec4<glw::GLfloat> dynamic_values[5];
	dynamic_values[0] = left;
	dynamic_values[1] = right;
	dynamic_values[2] = right;
	dynamic_values[3] = right;
	dynamic_values[4] = right;

	/* For each operation */
	for (GLuint i = 0; i < n_operations; ++i)
	{
		/* If result is failure */
		if (false == result[i])
		{
			const GLchar*					 description = 0;
			const Utils::vec4<glw::GLfloat>* input		 = 0;
			const GLchar*					 operation   = 0;

			switch (i)
			{
			case 0:
				description = "Call made with predefined array indices";
				input		= dynamic_values;
				operation   = functions;
				break;
			case 1:
				description = "Call made with predefined array indices in inverted order";
				input		= dynamic_values;
				operation   = functions_inverted;
				break;
			case 2:
				description = "Call made with predefined array indices, for constant values";
				input		= constant_values;
				operation   = functions;
				break;
			case 3:
				description = "Call made with predefined array indices in inverted order, for constant values";
				input		= constant_values;
				operation   = functions_inverted;
				break;
			case 4:
				description = "Call made with dynamic array indices";
				input		= dynamic_values;
				operation   = functions_dynamic;
				break;
			case 5:
				description = "Call made with dynamic array indices in inverted order";
				input		= dynamic_values;
				operation   = functions_dynamic_inverted;
				break;
			case 6:
				description = "Call made with loop";
				input		= dynamic_values;
				operation   = functions;
				break;
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
												<< tcu::TestLog::EndMessage;

			m_context.getTestContext().getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;

			tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Operation: ((((";
			input[0].log(message);
			for (GLuint function = 0; function < n_functions; ++function)
			{
				message << " " << operation[function] << " ";

				input[function + 1].log(message);

				message << ")";
			}

			message << tcu::TestLog::EndMessage;

			message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Result: ";
			vec4_result[i].log(message);

			message << tcu::TestLog::EndMessage;

			message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Expected: ";
			vec4_expected[i].log(message);

			message << tcu::TestLog::EndMessage;
		}

		/* Check array length, it should be 4 */
		if (4 != array_length)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Error. Invalid array length: " << array_length << ". Expected 4."
												<< tcu::TestLog::EndMessage;
		}
	}
}